

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O3

bool __thiscall
VW::config::options_serializer_boost_po::serialize_if_t<float>
          (options_serializer_boost_po *this,base_option *base_option)

{
  size_t sVar1;
  size_t sVar2;
  typed_option<float> *ptVar3;
  typed_option<float> typed;
  typed_option<float> local_c0;
  
  sVar1 = base_option->m_type_hash;
  sVar2 = std::type_info::hash_code((type_info *)&float::typeinfo);
  if (sVar1 == sVar2) {
    ptVar3 = (typed_option<float> *)
             __dynamic_cast(base_option,&config::base_option::typeinfo,
                            &typed_option<float>::typeinfo,0);
    if (ptVar3 == (typed_option<float> *)0x0) {
      __cxa_bad_cast();
    }
    typed_option<float>::typed_option(&local_c0,ptVar3);
    serialize<float>(this,&local_c0);
    local_c0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002d7e20;
    if (local_c0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_c0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    config::base_option::~base_option(&local_c0.super_base_option);
  }
  return sVar1 == sVar2;
}

Assistant:

bool serialize_if_t(base_option& base_option)
  {
    if (base_option.m_type_hash == typeid(T).hash_code())
    {
      auto typed = dynamic_cast<typed_option<T>&>(base_option);
      serialize(typed);
      return true;
    }

    return false;
  }